

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O3

void __thiscall
fasttext::Args::parseArgs
          (Args *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  char *pcVar6;
  ulong uVar7;
  pointer pbVar8;
  Args *this_00;
  int *piVar9;
  ulong uVar10;
  float fVar11;
  string command;
  char *local_90 [2];
  char local_80 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_70;
  Args *local_68;
  Args *local_60;
  Args *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_50[0] = local_40;
  pcVar1 = pbVar8[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + pbVar8[1]._M_string_length);
  iVar2 = std::__cxx11::string::compare((char *)local_50);
  if (iVar2 == 0) {
    this->loss = softmax;
    this->model = sup;
    this->minCount = 1;
    this->minn = 0;
    this->maxn = 0;
    this->lr = 0.1;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)local_50);
    if (iVar2 == 0) {
      this->model = cbow;
    }
  }
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) < 0x41) {
LAB_0011a382:
    if (((this->input)._M_string_length != 0) && ((this->output)._M_string_length != 0)) {
      if ((this->wordNgrams < 2) && (this->maxn == 0)) {
        this->bucket = 0;
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      return;
    }
LAB_0011a482:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Empty input or output path.",0x1b);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    printHelp(this);
LAB_0011a6a3:
    exit(1);
  }
  iVar2 = 2;
  uVar10 = 2;
  local_68 = (Args *)&this->pretrainedVectors;
  local_60 = (Args *)&this->label;
  local_58 = (Args *)&this->output;
  local_70 = args;
LAB_001196e5:
  if (*pbVar8[uVar10]._M_dataplus._M_p != '-') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Provided argument without a dash! Usage:",0x28);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    printHelp(this);
    goto LAB_0011a6a3;
  }
  iVar3 = std::__cxx11::string::compare((char *)(pbVar8 + uVar10));
  if (iVar3 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Here is the help! Usage:",0x18);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    printHelp(this);
    goto LAB_0011a6a3;
  }
  iVar3 = std::__cxx11::string::compare
                    ((char *)((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar10));
  if (iVar3 == 0) {
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar10 = (ulong)(iVar2 + 1);
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <= uVar10) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0011a444:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0011a452:
      std::__throw_invalid_argument("stof");
LAB_0011a45e:
      std::__throw_out_of_range("stoi");
LAB_0011a46a:
      std::__throw_invalid_argument("stoi");
LAB_0011a476:
      std::__throw_out_of_range("stof");
      goto LAB_0011a482;
    }
    pcVar1 = pbVar8[uVar10]._M_dataplus._M_p;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,pcVar1,pcVar1 + pbVar8[uVar10]._M_string_length);
    this_00 = this;
LAB_00119a80:
    std::__cxx11::string::operator=((string *)this_00,(string *)local_90);
    args = local_70;
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
      args = local_70;
    }
LAB_00119f48:
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    iVar2 = iVar2 + 2;
    uVar10 = (ulong)iVar2;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <= uVar10)
    goto LAB_0011a382;
    goto LAB_001196e5;
  }
  iVar3 = std::__cxx11::string::compare
                    ((char *)((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar10));
  if (iVar3 == 0) {
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar10 = (ulong)(iVar2 + 1);
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <= uVar10)
    goto LAB_0011a444;
    pcVar1 = pbVar8[uVar10]._M_dataplus._M_p;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,pcVar1,pcVar1 + pbVar8[uVar10]._M_string_length);
    this_00 = local_58;
    goto LAB_00119a80;
  }
  iVar3 = std::__cxx11::string::compare
                    ((char *)((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar10));
  if (iVar3 == 0) {
    piVar9 = (int *)(long)(iVar2 + 1);
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((int *)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <= piVar9)
    goto LAB_0011a59f;
    pcVar6 = pbVar8[(long)piVar9]._M_dataplus._M_p;
    piVar9 = __errno_location();
    iVar3 = *piVar9;
    *piVar9 = 0;
    fVar11 = strtof(pcVar6,local_90);
    if (local_90[0] == pcVar6) goto LAB_0011a452;
    if (*piVar9 == 0) {
      *piVar9 = iVar3;
    }
    else if (*piVar9 == 0x22) goto LAB_0011a476;
    this->lr = (double)fVar11;
    goto LAB_00119f48;
  }
  iVar3 = std::__cxx11::string::compare
                    ((char *)((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar10));
  if (iVar3 == 0) {
    piVar9 = (int *)(long)(iVar2 + 1);
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (piVar9 < (int *)((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5)) {
      pcVar6 = pbVar8[(long)piVar9]._M_dataplus._M_p;
      piVar9 = __errno_location();
      iVar3 = *piVar9;
      *piVar9 = 0;
      lVar4 = strtol(pcVar6,local_90,10);
      if (local_90[0] != pcVar6) {
        if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar9 != 0x22)) {
          if (*piVar9 == 0) {
            *piVar9 = iVar3;
          }
          this->lrUpdateRate = (int)lVar4;
          goto LAB_00119f48;
        }
        goto LAB_0011a45e;
      }
      goto LAB_0011a46a;
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar10));
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar10));
      if (iVar3 == 0) {
        piVar9 = (int *)(long)(iVar2 + 1);
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (piVar9 < (int *)((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5))
        {
          pcVar6 = pbVar8[(long)piVar9]._M_dataplus._M_p;
          piVar9 = __errno_location();
          iVar3 = *piVar9;
          *piVar9 = 0;
          lVar4 = strtol(pcVar6,local_90,10);
          if (local_90[0] != pcVar6) {
            pcVar6 = "-h";
            if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar9 != 0x22)) {
              if (*piVar9 == 0) {
                *piVar9 = iVar3;
              }
              this->ws = (int)lVar4;
              goto LAB_00119f48;
            }
            goto LAB_0011a4cc;
          }
          goto LAB_0011a4d8;
        }
        goto LAB_0011a59f;
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar10));
      if (iVar3 == 0) {
        piVar9 = (int *)(long)(iVar2 + 1);
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((int *)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <= piVar9
           ) goto LAB_0011a59f;
        pcVar6 = pbVar8[(long)piVar9]._M_dataplus._M_p;
        piVar9 = __errno_location();
        iVar3 = *piVar9;
        *piVar9 = 0;
        lVar4 = strtol(pcVar6,local_90,10);
        if (local_90[0] != pcVar6) {
          pcVar6 = "-h";
          if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar9 != 0x22)) {
            if (*piVar9 == 0) {
              *piVar9 = iVar3;
            }
            this->epoch = (int)lVar4;
            goto LAB_00119f48;
          }
          goto LAB_0011a4e4;
        }
        goto LAB_0011a4f0;
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar10));
      if (iVar3 == 0) {
        piVar9 = (int *)(long)(iVar2 + 1);
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((int *)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <= piVar9
           ) goto LAB_0011a59f;
        pcVar6 = pbVar8[(long)piVar9]._M_dataplus._M_p;
        piVar9 = __errno_location();
        iVar3 = *piVar9;
        *piVar9 = 0;
        lVar4 = strtol(pcVar6,local_90,10);
        if (local_90[0] != pcVar6) {
          pcVar6 = "-h";
          if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar9 != 0x22)) {
            if (*piVar9 == 0) {
              *piVar9 = iVar3;
            }
            this->minCount = (int)lVar4;
            goto LAB_00119f48;
          }
          goto LAB_0011a4fc;
        }
        goto LAB_0011a508;
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar10));
      if (iVar3 == 0) {
        piVar9 = (int *)(long)(iVar2 + 1);
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((int *)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <= piVar9
           ) goto LAB_0011a59f;
        pcVar6 = pbVar8[(long)piVar9]._M_dataplus._M_p;
        piVar9 = __errno_location();
        iVar3 = *piVar9;
        *piVar9 = 0;
        lVar4 = strtol(pcVar6,local_90,10);
        if (local_90[0] != pcVar6) {
          pcVar6 = "-h";
          if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar9 != 0x22)) {
            if (*piVar9 == 0) {
              *piVar9 = iVar3;
            }
            this->minCountLabel = (int)lVar4;
            goto LAB_00119f48;
          }
          goto LAB_0011a514;
        }
        goto LAB_0011a520;
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar10));
      if (iVar3 == 0) {
        piVar9 = (int *)(long)(iVar2 + 1);
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (piVar9 < (int *)((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5))
        {
          pcVar6 = pbVar8[(long)piVar9]._M_dataplus._M_p;
          piVar9 = __errno_location();
          iVar3 = *piVar9;
          *piVar9 = 0;
          lVar4 = strtol(pcVar6,local_90,10);
          if (local_90[0] != pcVar6) {
            pcVar6 = "-h";
            if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar9 != 0x22)) {
              if (*piVar9 == 0) {
                *piVar9 = iVar3;
              }
              this->neg = (int)lVar4;
              goto LAB_00119f48;
            }
            goto LAB_0011a52c;
          }
          goto LAB_0011a538;
        }
        goto LAB_0011a59f;
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar10));
      if (iVar3 == 0) {
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        piVar9 = (int *)(long)(iVar2 + 1);
        if (piVar9 < (int *)((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5))
        {
          iVar3 = std::__cxx11::stoi(pbVar8 + (long)piVar9,(size_t *)0x0,10);
          this->wordNgrams = iVar3;
          goto LAB_00119f48;
        }
        goto LAB_0011a59f;
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar10));
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar10));
        if (iVar3 == 0) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar9 = (int *)(long)(iVar2 + 1);
          if ((int *)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
              piVar9) goto LAB_0011a59f;
          iVar3 = std::__cxx11::stoi(pbVar8 + (long)piVar9,(size_t *)0x0,10);
          this->bucket = iVar3;
          goto LAB_00119f48;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar10));
        if (iVar3 == 0) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar9 = (int *)(long)(iVar2 + 1);
          if ((int *)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
              piVar9) goto LAB_0011a59f;
          iVar3 = std::__cxx11::stoi(pbVar8 + (long)piVar9,(size_t *)0x0,10);
          this->minn = iVar3;
          goto LAB_00119f48;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar10));
        if (iVar3 == 0) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar9 = (int *)(long)(iVar2 + 1);
          if ((int *)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
              piVar9) goto LAB_0011a59f;
          iVar3 = std::__cxx11::stoi(pbVar8 + (long)piVar9,(size_t *)0x0,10);
          this->maxn = iVar3;
          goto LAB_00119f48;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar10));
        if (iVar3 == 0) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar9 = (int *)(long)(iVar2 + 1);
          if ((int *)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
              piVar9) goto LAB_0011a59f;
          iVar3 = std::__cxx11::stoi(pbVar8 + (long)piVar9,(size_t *)0x0,10);
          this->thread = iVar3;
          goto LAB_00119f48;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar10));
        if (iVar3 == 0) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar9 = (int *)(long)(iVar2 + 1);
          if ((int *)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
              piVar9) goto LAB_0011a59f;
          fVar11 = std::__cxx11::stof(pbVar8 + (long)piVar9,(size_t *)0x0);
          this->t = (double)fVar11;
          goto LAB_00119f48;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar10));
        if (iVar3 == 0) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar7 = (ulong)(iVar2 + 1);
          if (uVar7 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5)
             ) {
            pcVar1 = pbVar8[uVar7]._M_dataplus._M_p;
            local_90[0] = local_80;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_90,pcVar1,pcVar1 + pbVar8[uVar7]._M_string_length);
            this_00 = local_60;
            goto LAB_00119a80;
          }
          goto LAB_0011a5b0;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar10));
        if (iVar3 == 0) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar9 = (int *)(long)(iVar2 + 1);
          if ((int *)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
              piVar9) goto LAB_0011a59f;
          iVar3 = std::__cxx11::stoi(pbVar8 + (long)piVar9,(size_t *)0x0,10);
          this->verbose = iVar3;
          goto LAB_00119f48;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar10));
        if (iVar3 == 0) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar7 = (ulong)(iVar2 + 1);
          if (uVar7 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5)
             ) {
            pcVar1 = pbVar8[uVar7]._M_dataplus._M_p;
            local_90[0] = local_80;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_90,pcVar1,pcVar1 + pbVar8[uVar7]._M_string_length);
            this_00 = local_68;
            goto LAB_00119a80;
          }
          goto LAB_0011a5be;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar10));
        if (iVar3 == 0) {
          iVar2 = iVar2 + -1;
          this->saveOutput = true;
          goto LAB_00119f48;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar10));
        if (iVar3 == 0) {
          iVar2 = iVar2 + -1;
          this->qnorm = true;
          goto LAB_00119f48;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar10));
        if (iVar3 == 0) {
          iVar2 = iVar2 + -1;
          this->retrain = true;
          goto LAB_00119f48;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar10));
        if (iVar3 == 0) {
          iVar2 = iVar2 + -1;
          this->qout = true;
          goto LAB_00119f48;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar10));
        if (iVar3 == 0) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar9 = (int *)(long)(iVar2 + 1);
          if ((int *)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
              piVar9) goto LAB_0011a59f;
          iVar3 = std::__cxx11::stoi(pbVar8 + (long)piVar9,(size_t *)0x0,10);
          this->cutoff = (long)iVar3;
          goto LAB_00119f48;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar10));
        if (iVar3 == 0) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar9 = (int *)(long)(iVar2 + 1);
          if ((int *)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
              piVar9) goto LAB_0011a59f;
          iVar3 = std::__cxx11::stoi(pbVar8 + (long)piVar9,(size_t *)0x0,10);
          this->dsub = (long)iVar3;
          goto LAB_00119f48;
        }
        goto LAB_0011a5cc;
      }
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      piVar9 = (int *)(long)(iVar2 + 1);
      if ((int *)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <= piVar9)
      goto LAB_0011a59f;
      pcVar6 = (char *)((long)piVar9 * 0x20);
      iVar3 = std::__cxx11::string::compare(pcVar6 + (long)pbVar8);
      if (iVar3 == 0) {
        this->loss = hs;
      }
      else {
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((int *)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <= piVar9
           ) goto LAB_0011a59f;
        iVar3 = std::__cxx11::string::compare(pcVar6 + (long)pbVar8);
        if (iVar3 == 0) {
          this->loss = ns;
        }
        else {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((int *)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
              piVar9) goto LAB_0011a59f;
          iVar3 = std::__cxx11::string::compare(pcVar6 + (long)pbVar8);
          if (iVar3 == 0) {
            this->loss = softmax;
          }
          else {
            pbVar8 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if ((int *)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
                piVar9) goto LAB_0011a59f;
            iVar3 = std::__cxx11::string::compare(pcVar6 + (long)pbVar8);
            if (iVar3 != 0) {
              pbVar8 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if ((int *)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
                  piVar9) goto LAB_0011a59f;
              iVar3 = std::__cxx11::string::compare(pcVar6 + (long)pbVar8);
              if (iVar3 != 0) goto LAB_0011a544;
            }
            this->loss = ova;
          }
        }
      }
      goto LAB_00119f48;
    }
    piVar9 = (int *)(long)(iVar2 + 1);
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((int *)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <= piVar9)
    goto LAB_0011a59f;
    pcVar6 = pbVar8[(long)piVar9]._M_dataplus._M_p;
    piVar9 = __errno_location();
    iVar3 = *piVar9;
    *piVar9 = 0;
    lVar4 = strtol(pcVar6,local_90,10);
    if (local_90[0] != pcVar6) {
      pcVar6 = "-h";
      if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar9 != 0x22)) {
        if (*piVar9 == 0) {
          *piVar9 = iVar3;
        }
        this->dim = (int)lVar4;
        goto LAB_00119f48;
      }
      std::__throw_out_of_range("stoi");
    }
    std::__throw_invalid_argument("stoi");
LAB_0011a4cc:
    std::__throw_out_of_range("stoi");
LAB_0011a4d8:
    std::__throw_invalid_argument("stoi");
LAB_0011a4e4:
    std::__throw_out_of_range("stoi");
LAB_0011a4f0:
    std::__throw_invalid_argument("stoi");
LAB_0011a4fc:
    std::__throw_out_of_range("stoi");
LAB_0011a508:
    std::__throw_invalid_argument("stoi");
LAB_0011a514:
    std::__throw_out_of_range("stoi");
LAB_0011a520:
    std::__throw_invalid_argument("stoi");
LAB_0011a52c:
    std::__throw_out_of_range("stoi");
LAB_0011a538:
    std::__throw_invalid_argument("stoi");
LAB_0011a544:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Unknown loss: ",0xe);
    pbVar8 = (local_70->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (piVar9 < (int *)((long)(local_70->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5)) {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,*(char **)(pcVar6 + (long)pbVar8),
                          *(long *)(pcVar6 + (long)&pbVar8->_M_string_length));
      std::endl<char,std::char_traits<char>>(poVar5);
      printHelp(this);
      goto LAB_0011a6a3;
    }
  }
LAB_0011a59f:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",piVar9);
LAB_0011a5b0:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0011a5be:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0011a5cc:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Unknown argument: ",0x12);
  pbVar8 = (local_70->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,pbVar8[uVar10]._M_dataplus._M_p,
                      pbVar8[uVar10]._M_string_length);
  std::endl<char,std::char_traits<char>>(poVar5);
  printHelp(this);
  goto LAB_0011a6a3;
}

Assistant:

void Args::parseArgs(const std::vector<std::string>& args) {
  std::string command(args[1]);
  if (command == "supervised") {
    model = model_name::sup;
    loss = loss_name::softmax;
    minCount = 1;
    minn = 0;
    maxn = 0;
    lr = 0.1;
  } else if (command == "cbow") {
    model = model_name::cbow;
  }
  for (int ai = 2; ai < args.size(); ai += 2) {
    if (args[ai][0] != '-') {
      std::cerr << "Provided argument without a dash! Usage:" << std::endl;
      printHelp();
      exit(EXIT_FAILURE);
    }
    try {
      if (args[ai] == "-h") {
        std::cerr << "Here is the help! Usage:" << std::endl;
        printHelp();
        exit(EXIT_FAILURE);
      } else if (args[ai] == "-input") {
        input = std::string(args.at(ai + 1));
      } else if (args[ai] == "-output") {
        output = std::string(args.at(ai + 1));
      } else if (args[ai] == "-lr") {
        lr = std::stof(args.at(ai + 1));
      } else if (args[ai] == "-lrUpdateRate") {
        lrUpdateRate = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-dim") {
        dim = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-ws") {
        ws = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-epoch") {
        epoch = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-minCount") {
        minCount = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-minCountLabel") {
        minCountLabel = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-neg") {
        neg = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-wordNgrams") {
        wordNgrams = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-loss") {
        if (args.at(ai + 1) == "hs") {
          loss = loss_name::hs;
        } else if (args.at(ai + 1) == "ns") {
          loss = loss_name::ns;
        } else if (args.at(ai + 1) == "softmax") {
          loss = loss_name::softmax;
        } else if (
            args.at(ai + 1) == "one-vs-all" || args.at(ai + 1) == "ova") {
          loss = loss_name::ova;
        } else {
          std::cerr << "Unknown loss: " << args.at(ai + 1) << std::endl;
          printHelp();
          exit(EXIT_FAILURE);
        }
      } else if (args[ai] == "-bucket") {
        bucket = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-minn") {
        minn = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-maxn") {
        maxn = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-thread") {
        thread = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-t") {
        t = std::stof(args.at(ai + 1));
      } else if (args[ai] == "-label") {
        label = std::string(args.at(ai + 1));
      } else if (args[ai] == "-verbose") {
        verbose = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-pretrainedVectors") {
        pretrainedVectors = std::string(args.at(ai + 1));
      } else if (args[ai] == "-saveOutput") {
        saveOutput = true;
        ai--;
      } else if (args[ai] == "-qnorm") {
        qnorm = true;
        ai--;
      } else if (args[ai] == "-retrain") {
        retrain = true;
        ai--;
      } else if (args[ai] == "-qout") {
        qout = true;
        ai--;
      } else if (args[ai] == "-cutoff") {
        cutoff = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-dsub") {
        dsub = std::stoi(args.at(ai + 1));
      } else {
        std::cerr << "Unknown argument: " << args[ai] << std::endl;
        printHelp();
        exit(EXIT_FAILURE);
      }
    } catch (std::out_of_range&) {
      std::cerr << args[ai] << " is missing an argument" << std::endl;
      printHelp();
      exit(EXIT_FAILURE);
    }
  }
  if (input.empty() || output.empty()) {
    std::cerr << "Empty input or output path." << std::endl;
    printHelp();
    exit(EXIT_FAILURE);
  }
  if (wordNgrams <= 1 && maxn == 0) {
    bucket = 0;
  }
}